

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::SpreadArrayArgs
              (Var arrayToSpread,AuxArray<unsigned_int> *spreadIndices,ScriptContext *scriptContext)

{
  List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  WriteBarrierPtr<void> *pWVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  uint32 uVar6;
  BOOL BVar7;
  JavascriptCopyOnAccessNativeIntArray *this;
  JavascriptArray *srcArray;
  undefined4 extraout_var;
  Var pvVar8;
  JavascriptArray *dstArray;
  undefined4 *puVar9;
  JavascriptArray *pJVar10;
  undefined4 extraout_var_00;
  SpreadArgument *pSVar11;
  uint start;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  Type elementCount;
  undefined1 local_a8 [8];
  anon_class_16_2_4d2d011e slowCopy;
  ScriptContext *local_90;
  ScriptContext *scriptContext_local;
  anon_class_8_1_9014563a needArraySlowCopy;
  ScriptContextInfo local_70;
  JsReentLock jsReentLock;
  uint local_38;
  uint local_34;
  
  local_70._vptr_ScriptContextInfo = (_func_int **)scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ =
       ((ThreadContext *)local_70._vptr_ScriptContextInfo)->noJsReentrancy;
  ((ThreadContext *)local_70._vptr_ScriptContextInfo)->noJsReentrancy = true;
  local_90 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)&stack0xffffffffffffff90,arrayToSpread);
  if (((arrayToSpread != (Var)0x0) &&
      (bVar4 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(arrayToSpread), bVar4)) &&
     (this = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(arrayToSpread),
     this != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this);
  }
  srcArray = VarTo<Js::JavascriptArray>(arrayToSpread);
  elementCount = (srcArray->super_ArrayObject).length;
  jsReentLock._28_4_ = elementCount;
  if (spreadIndices->count != 0) {
    uVar12 = 0;
    do {
      *(undefined1 *)(local_70._vptr_ScriptContextInfo + 0x21) = jsReentLock.m_arrayObject2._0_1_;
      iVar5 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x72])(srcArray,(ulong)spreadIndices[uVar12 + 1].count);
      uVar6 = GetSpreadArgLen((Var)CONCAT44(extraout_var,iVar5),local_90);
      uVar14 = elementCount - 1;
      elementCount = uVar14 + uVar6;
      if (CARRY4(uVar14,uVar6)) {
        ::Math::DefaultOverflowPolicy();
      }
      JsReentLock::MutateArrayObject((JsReentLock *)&stack0xffffffffffffff90);
      *(bool *)(local_70._vptr_ScriptContextInfo + 0x21) = true;
      uVar12 = uVar12 + 1;
    } while (uVar12 < spreadIndices->count);
  }
  needArraySlowCopy.jsReentLock = (JsReentLock *)spreadIndices;
  pvVar8 = OP_NewScArrayWithMissingValues(elementCount,local_90);
  dstArray = VarTo<Js::JavascriptArray>(pvVar8);
  uVar6 = jsReentLock._28_4_;
  if ((jsReentLock._28_4_ != 0) && (elementCount != 0)) {
    uVar12 = 0;
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_34 = 0;
    local_38 = 0;
    slowCopy.needArraySlowCopy = (anon_class_8_1_9014563a *)srcArray;
    do {
      uVar14 = *(uint *)((long)&(needArraySlowCopy.jsReentLock)->m_threadContext +
                        (ulong)local_38 * 4 + 4);
      scriptContext_local = (ScriptContext *)&stack0xffffffffffffff90;
      local_a8 = (undefined1  [8])&local_90;
      slowCopy.scriptContext = &scriptContext_local;
      start = (uint)uVar12;
      if (start < uVar14) {
        bVar4 = IsNonES5Array(srcArray);
        if ((bVar4) &&
           (pJVar10 = UnsafeVarTo<Js::JavascriptArray>(srcArray), pJVar10 != (JavascriptArray *)0x0)
           ) {
          *(bool *)((scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo + 0x21) =
               (scriptContext_local->super_ScriptContextBase).isClosed;
          iVar5 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x66])(pJVar10);
          if ((iVar5 == 0) && (bVar4 = IsFillFromPrototypes(pJVar10), !bVar4)) goto LAB_00b8435d;
          SpreadArrayArgs::anon_class_16_2_4d2d011e::operator()
                    ((anon_class_16_2_4d2d011e *)local_a8,dstArray,local_34,srcArray,start,uVar14);
        }
        else {
LAB_00b8435d:
          *(undefined1 *)(local_70._vptr_ScriptContextInfo + 0x21) =
               jsReentLock.m_arrayObject2._0_1_;
          CopyAnyArrayElementsToVar<unsigned_int>(dstArray,local_34,srcArray,start,uVar14);
          JsReentLock::MutateArrayObject((JsReentLock *)&stack0xffffffffffffff90);
          *(bool *)(local_70._vptr_ScriptContextInfo + 0x21) = true;
        }
        local_34 = (local_34 - start) + uVar14;
      }
      else {
        if (uVar14 < start) {
          if (local_38 != *(int *)&(needArraySlowCopy.jsReentLock)->m_threadContext - 1U) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2dee,"(spreadArrIndex == spreadIndices->count - 1)",
                                        "spreadArrIndex == spreadIndices->count - 1");
            if (!bVar4) goto LAB_00b845b2;
            *puVar9 = 0;
          }
          bVar4 = IsNonES5Array(srcArray);
          if ((bVar4) &&
             (pJVar10 = UnsafeVarTo<Js::JavascriptArray>(srcArray),
             pJVar10 != (JavascriptArray *)0x0)) {
            *(bool *)((scriptContext_local->super_ScriptContextInfo)._vptr_ScriptContextInfo + 0x21)
                 = (scriptContext_local->super_ScriptContextBase).isClosed;
            iVar5 = (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x66])(pJVar10);
            if ((iVar5 != 0) || (bVar4 = IsFillFromPrototypes(pJVar10), bVar4)) {
              SpreadArrayArgs::anon_class_16_2_4d2d011e::operator()
                        ((anon_class_16_2_4d2d011e *)local_a8,dstArray,local_34,srcArray,start,uVar6
                        );
              break;
            }
          }
          *(undefined1 *)(local_70._vptr_ScriptContextInfo + 0x21) =
               jsReentLock.m_arrayObject2._0_1_;
          CopyAnyArrayElementsToVar<unsigned_int>(dstArray,local_34,srcArray,start,uVar6);
          JsReentLock::MutateArrayObject((JsReentLock *)&stack0xffffffffffffff90);
          *(bool *)(local_70._vptr_ScriptContextInfo + 0x21) = true;
          break;
        }
        *(undefined1 *)(local_70._vptr_ScriptContextInfo + 0x21) = jsReentLock.m_arrayObject2._0_1_;
        iVar5 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(srcArray,uVar12);
        pvVar8 = (Var)CONCAT44(extraout_var_00,iVar5);
        JsReentLock::MutateArrayObject((JsReentLock *)&stack0xffffffffffffff90);
        *(bool *)(local_70._vptr_ScriptContextInfo + 0x21) = true;
        bVar4 = VarIs<Js::SpreadArgument>(pvVar8);
        if (bVar4) {
          pSVar11 = VarTo<Js::SpreadArgument>(pvVar8);
          pLVar1 = (pSVar11->iteratorIndices).ptr;
          if ((pLVar1 != (List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                          *)0x0) &&
             (uVar12 = (ulong)(uint)(pLVar1->
                                    super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).
                                    count, uVar12 != 0)) {
            pWVar2 = (pLVar1->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).buffer.
                     ptr;
            uVar13 = 0;
            do {
              DirectSetItemAt<void*>(dstArray,local_34 + (int)uVar13,pWVar2[uVar13].ptr);
              uVar13 = uVar13 + 1;
            } while (uVar12 != uVar13);
            local_34 = local_34 + (int)uVar13;
            srcArray = (JavascriptArray *)slowCopy.needArraySlowCopy;
            uVar6 = jsReentLock._28_4_;
          }
        }
        else {
          BVar7 = JavascriptOperators::IsUndefinedObject(pvVar8);
          if (BVar7 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x2e0a,"(JavascriptOperators::IsUndefinedObject(instance))"
                                        ,"JavascriptOperators::IsUndefinedObject(instance)");
            if (!bVar4) goto LAB_00b845b2;
            *puVar9 = 0;
          }
          DirectSetItemAt<void*>(dstArray,local_34,pvVar8);
          local_34 = local_34 + 1;
        }
        local_38 = local_38 +
                   (local_38 < *(int *)&(needArraySlowCopy.jsReentLock)->m_threadContext - 1U);
        uVar14 = start + 1;
      }
      if ((uVar6 <= uVar14) || (uVar12 = (ulong)uVar14, elementCount <= local_34)) break;
    } while( true );
  }
  if (uVar6 != (srcArray->super_ArrayObject).length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2e14,"(arrayLength == array->GetLength())",
                                "Array\'s length should not have changed");
    if (!bVar4) {
LAB_00b845b2:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  *(undefined1 *)(local_70._vptr_ScriptContextInfo + 0x21) = jsReentLock.m_arrayObject2._0_1_;
  return dstArray;
}

Assistant:

Var JavascriptArray::SpreadArrayArgs(Var arrayToSpread, const Js::AuxArray<uint32> *spreadIndices, ScriptContext *scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, arrayToSpread);

        // At this stage we have an array literal with some arguments to be spread.
        // First we need to calculate the real size of the final literal.
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayToSpread);
#endif
        JavascriptArray *array = VarTo<JavascriptArray>(arrayToSpread);
        uint32 arrayLength = array->GetLength();
        uint32 actualLength = arrayLength;

        for (unsigned i = 0; i < spreadIndices->count; ++i)
        {
            JS_REENTRANT(jsReentLock,
                actualLength = UInt32Math::Add(actualLength - 1, GetSpreadArgLen(array->DirectGetItem(spreadIndices->elements[i]), scriptContext)));
        }

        JavascriptArray *result = VarTo<JavascriptArray>(OP_NewScArrayWithMissingValues(actualLength, scriptContext));

        // Now we copy each element and expand the spread parameters inline.
        for (unsigned i = 0, spreadArrIndex = 0, resultIndex = 0; i < arrayLength && resultIndex < actualLength; ++i)
        {
            uint32 spreadIndex = spreadIndices->elements[spreadArrIndex]; // The index of the next element to be spread.

            // An array needs a slow copy if it is a cross-site object or we have missing values that need to be set to undefined.
            auto needArraySlowCopy = [&](Var instance) {
                JavascriptArray *arr = JavascriptArray::TryVarToNonES5Array(instance);
                if (arr)
                {
                    JS_REENTRANT_UNLOCK(jsReentLock, return arr->IsCrossSiteObject() || arr->IsFillFromPrototypes());
                }
                return false;
            };

            // Designed to have interchangeable arguments with CopyAnyArrayElementsToVar.
            auto slowCopy = [&scriptContext, &needArraySlowCopy
                ](JavascriptArray *dstArray, unsigned dstIndex, Var srcArray, uint32 start, uint32 end) {
                Assert(needArraySlowCopy(srcArray) || VarIs<ArgumentsObject>(srcArray) || VarIs<TypedArrayBase>(srcArray) || VarIs<JavascriptString>(srcArray));
                JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

                RecyclableObject *propertyObject;
                if (!JavascriptOperators::GetPropertyObject(srcArray, scriptContext, &propertyObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_InvalidSpreadArgument);
                }

                for (uint32 j = start; j < end; j++)
                {
                    Var element;
                    JS_REENTRANT(jsReentLock, BOOL gotItem = JavascriptOperators::GetItem(srcArray, propertyObject, j, &element, scriptContext));
                    if (!gotItem)
                    {
                        // skip elided elements
                        dstIndex++;
                    }
                    else
                    {
                        dstArray->DirectSetItemAt(dstIndex++, element);
                    }
                }
            };

            if (i < spreadIndex)
            {
                // Any non-spread elements can be copied in bulk.

                if (needArraySlowCopy(array))
                {
                    slowCopy(result, resultIndex, (Var)array, i, spreadIndex);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, CopyAnyArrayElementsToVar(result, resultIndex, array, i, spreadIndex));
                }
                resultIndex += spreadIndex - i;
                i = spreadIndex - 1;
                continue;
            }
            else if (i > spreadIndex)
            {
                // Any non-spread elements terminating the array can also be copied in bulk.
                Assert(spreadArrIndex == spreadIndices->count - 1);
                if (needArraySlowCopy(array))
                {
                    slowCopy(result, resultIndex, array, i, arrayLength);
                }
                else
                {
                    JS_REENTRANT(jsReentLock, CopyAnyArrayElementsToVar(result, resultIndex, array, i, arrayLength));
                }
                break;
            }
            else
            {
                JS_REENTRANT(jsReentLock, Var instance = array->DirectGetItem(i));

                if (VarIs<SpreadArgument>(instance))
                {
                    SpreadArgument* spreadArgument = VarTo<SpreadArgument>(instance);
                    uint32 len = spreadArgument->GetArgumentSpreadCount();
                    const Var*  spreadItems = spreadArgument->GetArgumentSpread();
                    for (uint32 j = 0; j < len; j++)
                    {
                        result->DirectSetItemAt(resultIndex++, spreadItems[j]);
                    }

                }
                else
                {
                    Assert(JavascriptOperators::IsUndefinedObject(instance));
                    result->DirectSetItemAt(resultIndex++, instance);
                }

                if (spreadArrIndex < spreadIndices->count - 1)
                {
                    spreadArrIndex++;
                }
            }
        }
        AssertMsg(arrayLength == array->GetLength(), "Array's length should not have changed");
        return result;
    }